

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Index.cpp
# Opt level: O2

IndexTableSegment * __thiscall
ASDCP::MXF::IndexTableSegment::InitFromTLVSet(IndexTableSegment *this,TLVReader *TLVSet)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  MDDEntry *pMVar4;
  ILogSink *this_00;
  TLVReader *in_RDX;
  undefined1 *puVar5;
  ui32_t i;
  uint uVar6;
  ui32_t item_size;
  ui32_t item_count;
  IndexEntry tmp_item;
  Result_t result;
  
  InterchangeObject::InitFromTLVSet((InterchangeObject *)&result,TLVSet);
  if (-1 < _result) {
    pMVar4 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_IndexTableSegmentBase_IndexEditRate);
    TLVReader::ReadObject((TLVReader *)&tmp_item,(MDDEntry *)in_RDX,(IArchive *)pMVar4);
    Kumu::Result_t::operator=(&result,(Result_t *)&tmp_item);
    Kumu::Result_t::~Result_t((Result_t *)&tmp_item);
    if (-1 < _result) {
      pMVar4 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                MDD_IndexTableSegmentBase_IndexStartPosition);
      TLVReader::ReadUi64((TLVReader *)&tmp_item,(MDDEntry *)in_RDX,(ui64_t *)pMVar4);
      Kumu::Result_t::operator=(&result,(Result_t *)&tmp_item);
      Kumu::Result_t::~Result_t((Result_t *)&tmp_item);
      if (-1 < _result) {
        pMVar4 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                  MDD_IndexTableSegmentBase_IndexDuration);
        TLVReader::ReadUi64((TLVReader *)&tmp_item,(MDDEntry *)in_RDX,(ui64_t *)pMVar4);
        Kumu::Result_t::operator=(&result,(Result_t *)&tmp_item);
        Kumu::Result_t::~Result_t((Result_t *)&tmp_item);
        if (-1 < _result) {
          pMVar4 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                    MDD_IndexTableSegmentBase_EditUnitByteCount);
          TLVReader::ReadUi32((TLVReader *)&tmp_item,(MDDEntry *)in_RDX,(ui32_t *)pMVar4);
          Kumu::Result_t::operator=(&result,(Result_t *)&tmp_item);
          Kumu::Result_t::~Result_t((Result_t *)&tmp_item);
          if (-1 < _result) {
            pMVar4 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                      MDD_Core_IndexSID);
            TLVReader::ReadUi32((TLVReader *)&tmp_item,(MDDEntry *)in_RDX,(ui32_t *)pMVar4);
            Kumu::Result_t::operator=(&result,(Result_t *)&tmp_item);
            Kumu::Result_t::~Result_t((Result_t *)&tmp_item);
            if (-1 < _result) {
              pMVar4 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                        MDD_Core_BodySID);
              TLVReader::ReadUi32((TLVReader *)&tmp_item,(MDDEntry *)in_RDX,(ui32_t *)pMVar4);
              Kumu::Result_t::operator=(&result,(Result_t *)&tmp_item);
              Kumu::Result_t::~Result_t((Result_t *)&tmp_item);
              if (-1 < _result) {
                pMVar4 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                          MDD_IndexTableSegmentBase_SliceCount);
                TLVReader::ReadUi8((TLVReader *)&tmp_item,(MDDEntry *)in_RDX,pMVar4->ul);
                Kumu::Result_t::operator=(&result,(Result_t *)&tmp_item);
                Kumu::Result_t::~Result_t((Result_t *)&tmp_item);
                if (-1 < _result) {
                  pMVar4 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                            MDD_IndexTableSegmentBase_PosTableCount);
                  TLVReader::ReadUi8((TLVReader *)&tmp_item,(MDDEntry *)in_RDX,pMVar4->ul);
                  Kumu::Result_t::operator=(&result,(Result_t *)&tmp_item);
                  Kumu::Result_t::~Result_t((Result_t *)&tmp_item);
                  if (-1 < _result) {
                    pMVar4 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                              MDD_IndexTableSegment_DeltaEntryArray);
                    TLVReader::ReadObject
                              ((TLVReader *)&tmp_item,(MDDEntry *)in_RDX,(IArchive *)pMVar4);
                    Kumu::Result_t::operator=(&result,(Result_t *)&tmp_item);
                    Kumu::Result_t::~Result_t((Result_t *)&tmp_item);
                    if (-1 < _result) {
                      pMVar4 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                                MDD_IndexTableSegment_IndexEntryArray);
                      bVar1 = TLVReader::FindTL(in_RDX,pMVar4);
                      if (bVar1) {
                        bVar2 = Kumu::MemIOReader::ReadUi32BE
                                          (&in_RDX->super_MemIOReader,&item_count);
                        bVar1 = true;
                        if (bVar2) {
                          bVar2 = Kumu::MemIOReader::ReadUi32BE
                                            (&in_RDX->super_MemIOReader,&item_size);
                          if (bVar2) {
                            uVar6 = 0;
                            bVar1 = true;
                            while ((uVar6 < item_count && (bVar1))) {
                              tmp_item.super_IArchive._vptr_IArchive =
                                   (_func_int **)&PTR__IArchive_00216bc8;
                              tmp_item.TemporalOffset = '\0';
                              tmp_item.KeyFrameOffset = '\0';
                              tmp_item.Flags = 0x80;
                              tmp_item.StreamOffset = 0;
                              bVar1 = IndexEntry::Unarchive(&tmp_item,&in_RDX->super_MemIOReader);
                              if (bVar1) {
                                std::
                                vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
                                ::push_back((vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
                                             *)&TLVSet[3].m_ElementMap._M_t._M_impl.
                                                super__Rb_tree_header._M_header._M_right,&tmp_item);
                                bVar1 = true;
                                if (0xb < item_size) {
                                  uVar3 = (item_size + (in_RDX->super_MemIOReader).m_size) - 0xb;
                                  if ((in_RDX->super_MemIOReader).m_capacity < uVar3)
                                  goto LAB_001a0911;
                                  (in_RDX->super_MemIOReader).m_size = uVar3;
                                }
                              }
                              else {
LAB_001a0911:
                                bVar1 = false;
                              }
                              uVar6 = uVar6 + 1;
                            }
                            if ((long)(TLVSet[3].m_ElementMap._M_t._M_impl.super__Rb_tree_header.
                                       _M_node_count -
                                      (long)TLVSet[3].m_ElementMap._M_t._M_impl.
                                            super__Rb_tree_header._M_header._M_right) / 0x18 !=
                                (ulong)item_count) {
                              this_00 = (ILogSink *)Kumu::DefaultLogSink();
                              Kumu::ILogSink::Error
                                        (this_00,
                                         "Malformed index table segment, could not decode all IndexEntries.\n"
                                        );
                              Kumu::Result_t::Result_t
                                        ((Result_t *)this,(Result_t *)ASDCP::RESULT_KLV_CODING);
                              goto LAB_001a0975;
                            }
                          }
                        }
                        puVar5 = Kumu::RESULT_FALSE;
                        if (bVar1) {
                          puVar5 = Kumu::RESULT_OK;
                        }
                      }
                      else {
                        puVar5 = Kumu::RESULT_FALSE;
                      }
                      Kumu::Result_t::operator=(&result,(Result_t *)puVar5);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  Kumu::Result_t::Result_t((Result_t *)this,&result);
LAB_001a0975:
  Kumu::Result_t::~Result_t(&result);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::IndexTableSegment::InitFromTLVSet(TLVReader& TLVSet)
{
  Result_t result = InterchangeObject::InitFromTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(IndexTableSegmentBase, IndexEditRate));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi64(OBJ_READ_ARGS(IndexTableSegmentBase, IndexStartPosition));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi64(OBJ_READ_ARGS(IndexTableSegmentBase, IndexDuration));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi32(OBJ_READ_ARGS(IndexTableSegmentBase, EditUnitByteCount));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi32(OBJ_READ_ARGS(IndexTableSegmentBase, IndexSID));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi32(OBJ_READ_ARGS(EssenceContainerData, BodySID));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi8(OBJ_READ_ARGS(IndexTableSegmentBase, SliceCount));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi8(OBJ_READ_ARGS(IndexTableSegmentBase, PosTableCount));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(IndexTableSegment, DeltaEntryArray));

  if ( ASDCP_SUCCESS(result) )
    {
      bool rc = TLVSet.FindTL(m_Dict->Type(MDD_IndexTableSegment_IndexEntryArray));

      if ( rc )
	{
	  ui32_t item_count, item_size;
	  ui32_t const decoder_item_size = IndexEntryArray.ItemSize();

	  if ( TLVSet.ReadUi32BE(&item_count) )
	    {
	      if ( TLVSet.ReadUi32BE(&item_size) )
		{
		  for ( ui32_t i = 0; i < item_count && rc; ++i )
		    {
		      IndexEntry tmp_item;
		      rc = tmp_item.Unarchive(&TLVSet);

		      if ( rc )
			{
			  IndexEntryArray.push_back(tmp_item);

			  if ( decoder_item_size < item_size )
			    {
			      rc = TLVSet.SkipOffset(item_size - decoder_item_size);
			    }
			}
		    }
          if (IndexEntryArray.size() != item_count)
          {
              DefaultLogSink().Error("Malformed index table segment, could not decode all IndexEntries.\n");
              return RESULT_KLV_CODING;
          }
		}
	    }
	}

      result = rc ? RESULT_OK : RESULT_FALSE;
    }

  return result;
}